

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O3

kvtree_elem * kvtree_elem_extract_int(kvtree *hash,int key)

{
  kvtree_elem_struct *pkVar1;
  kvtree_elem_struct **ppkVar2;
  kvtree_elem *pkVar3;
  char tmp [100];
  char acStack_78 [104];
  
  sprintf(acStack_78,"%d",key);
  pkVar3 = kvtree_elem_get(hash,acStack_78);
  if (pkVar3 != (kvtree_elem *)0x0) {
    pkVar1 = (pkVar3->pointers).le_next;
    ppkVar2 = (pkVar3->pointers).le_prev;
    if (pkVar1 != (kvtree_elem_struct *)0x0) {
      (pkVar1->pointers).le_prev = ppkVar2;
    }
    *ppkVar2 = pkVar1;
  }
  return pkVar3;
}

Assistant:

kvtree_elem* kvtree_elem_extract_int(kvtree* hash, int key)
{
  char tmp[100];
  sprintf(tmp, "%d", key);

  kvtree_elem* elem = kvtree_elem_get(hash, tmp);
  if (elem != NULL) {
    LIST_REMOVE(elem, pointers);
  }
  return elem;
}